

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O1

void board::makemove::undo(Board *pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pUVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pos->ply = pos->ply + -1;
  pUVar5 = (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = pUVar5[-1].castlePerm;
  iVar2 = pUVar5[-1].enPas;
  iVar3 = pUVar5[-1].fiftyMove;
  uVar4 = pUVar5[-1].moveValue;
  (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_finish = pUVar5 + -1;
  pos->fiftyMove = iVar3;
  if ((long)pos->enPas != 99) {
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][pos->enPas];
  }
  uVar11 = uVar4 & 0x7f;
  uVar12 = uVar4 >> 7 & 0x7f;
  pos->enPas = iVar2;
  if (iVar2 != 99) {
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][iVar2];
  }
  uVar6 = pos->hashKey ^ Board::CASTLE_KEYS[pos->castlePerm];
  pos->hashKey = uVar6;
  pos->castlePerm = iVar1;
  uVar6 = uVar6 ^ Board::CASTLE_KEYS[iVar1];
  pos->hashKey = uVar6;
  uVar13 = pos->side;
  pos->side = uVar13 ^ 1;
  uVar6 = uVar6 ^ Board::SIDE_KEY;
  pos->hashKey = uVar6;
  if ((uVar4 >> 0x12 & 1) == 0) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      if (uVar12 < 0x5d) {
        if (uVar12 == 0x17) {
          iVar1 = pos->board[0x18];
          iVar2 = Board::PIECE_COLOR[iVar1];
          uVar6 = uVar6 ^ Board::PIECE_KEYS[iVar1][0x15];
          pos->hashKey = uVar6;
          pos->hashKey = uVar6 ^ Board::PIECE_KEYS[iVar1][0x18];
          pos->board[0x18] = 0;
          pos->board[0x15] = iVar1;
          if (Board::PIECE_NO_TEAM[iVar1] == 1) {
            bitboard::clearBit(pos->pawns + iVar2,3);
            bitboard::clearBit(pos->pawns + 2,3);
            bitboard::setBit(pos->pawns + iVar2,0);
            bitboard::setBit(pos->pawns + 2,0);
          }
          if (0 < (long)pos->pNum[iVar1]) {
            lVar8 = 0;
            do {
              if (pos->pList[iVar1][lVar8] == 0x18) {
                pos->pList[iVar1][lVar8] = 0x15;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (pos->pNum[iVar1] != lVar8);
          }
        }
        else if (uVar12 == 0x1b) {
          iVar1 = pos->board[0x1a];
          iVar2 = Board::PIECE_COLOR[iVar1];
          uVar6 = uVar6 ^ Board::PIECE_KEYS[iVar1][0x1c];
          pos->hashKey = uVar6;
          pos->hashKey = uVar6 ^ Board::PIECE_KEYS[iVar1][0x1a];
          pos->board[0x1a] = 0;
          pos->board[0x1c] = iVar1;
          if (Board::PIECE_NO_TEAM[iVar1] == 1) {
            bitboard::clearBit(pos->pawns + iVar2,5);
            bitboard::clearBit(pos->pawns + 2,5);
            bitboard::setBit(pos->pawns + iVar2,7);
            bitboard::setBit(pos->pawns + 2,7);
          }
          if (0 < (long)pos->pNum[iVar1]) {
            lVar8 = 0;
            do {
              if (pos->pList[iVar1][lVar8] == 0x1a) {
                pos->pList[iVar1][lVar8] = 0x1c;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (pos->pNum[iVar1] != lVar8);
          }
        }
      }
      else if (uVar12 == 0x5d) {
        iVar1 = pos->board[0x5e];
        iVar2 = Board::PIECE_COLOR[iVar1];
        uVar6 = uVar6 ^ Board::PIECE_KEYS[iVar1][0x5b];
        pos->hashKey = uVar6;
        pos->hashKey = uVar6 ^ Board::PIECE_KEYS[iVar1][0x5e];
        pos->board[0x5e] = 0;
        pos->board[0x5b] = iVar1;
        if (Board::PIECE_NO_TEAM[iVar1] == 1) {
          bitboard::clearBit(pos->pawns + iVar2,0x3b);
          bitboard::clearBit(pos->pawns + 2,0x3b);
          bitboard::setBit(pos->pawns + iVar2,0x38);
          bitboard::setBit(pos->pawns + 2,0x38);
        }
        if (0 < (long)pos->pNum[iVar1]) {
          lVar8 = 0;
          do {
            if (pos->pList[iVar1][lVar8] == 0x5e) {
              pos->pList[iVar1][lVar8] = 0x5b;
              break;
            }
            lVar8 = lVar8 + 1;
          } while (pos->pNum[iVar1] != lVar8);
        }
      }
      else if (uVar12 == 0x61) {
        iVar1 = pos->board[0x60];
        iVar2 = Board::PIECE_COLOR[iVar1];
        uVar6 = uVar6 ^ Board::PIECE_KEYS[iVar1][0x62];
        pos->hashKey = uVar6;
        pos->hashKey = uVar6 ^ Board::PIECE_KEYS[iVar1][0x60];
        pos->board[0x60] = 0;
        pos->board[0x62] = iVar1;
        if (Board::PIECE_NO_TEAM[iVar1] == 1) {
          bitboard::clearBit(pos->pawns + iVar2,0x3d);
          bitboard::clearBit(pos->pawns + 2,0x3d);
          bitboard::setBit(pos->pawns + iVar2,0x3f);
          bitboard::setBit(pos->pawns + 2,0x3f);
        }
        if (0 < (long)pos->pNum[iVar1]) {
          lVar8 = 0;
          do {
            if (pos->pList[iVar1][lVar8] == 0x60) {
              pos->pList[iVar1][lVar8] = 0x62;
              break;
            }
            lVar8 = lVar8 + 1;
          } while (pos->pNum[iVar1] != lVar8);
        }
      }
    }
  }
  else if (uVar13 == 1) {
    pos->material[1] = pos->material[1] + 100;
    pos->board[(ulong)uVar12 - 10] = 7;
    pos->hashKey = uVar6 ^ Board::PIECE_KEYS[6][(ulong)uVar12 + 0x6e];
    iVar1 = Board::SQ64[(ulong)uVar12 - 10];
    bitboard::setBit(pos->pawns + 1,iVar1);
    bitboard::setBit(pos->pawns + 2,iVar1);
    pos->pList[7][pos->pNum[7]] = uVar12 - 10;
    pos->pNum[7] = pos->pNum[7] + 1;
  }
  else {
    uVar13 = uVar12 + 10;
    pos->material[0] = pos->material[0] + 100;
    pos->board[uVar13] = 1;
    pos->hashKey = uVar6 ^ Board::PIECE_KEYS[1][uVar13];
    iVar1 = Board::SQ64[(ulong)uVar12 + 10];
    bitboard::setBit(pos->pawns,iVar1);
    bitboard::setBit(pos->pawns + 2,iVar1);
    pos->pList[1][pos->pNum[1]] = uVar13;
    pos->pNum[1] = pos->pNum[1] + 1;
  }
  iVar1 = pos->board[uVar12];
  iVar2 = Board::PIECE_COLOR[iVar1];
  uVar6 = pos->hashKey ^ Board::PIECE_KEYS[iVar1][uVar11];
  pos->hashKey = uVar6;
  pos->hashKey = uVar6 ^ Board::PIECE_KEYS[iVar1][uVar12];
  pos->board[uVar12] = 0;
  pos->board[uVar11] = iVar1;
  if (Board::PIECE_NO_TEAM[iVar1] == 1) {
    iVar3 = Board::SQ64[uVar12];
    bitboard::clearBit(pos->pawns + iVar2,iVar3);
    bitboard::clearBit(pos->pawns + 2,iVar3);
    iVar3 = Board::SQ64[uVar11];
    bitboard::setBit(pos->pawns + iVar2,iVar3);
    bitboard::setBit(pos->pawns + 2,iVar3);
  }
  uVar13 = uVar4 >> 0xe & 0xf;
  if (0 < (long)pos->pNum[iVar1]) {
    lVar8 = 0;
    do {
      if (pos->pList[iVar1][lVar8] == uVar12) {
        pos->pList[iVar1][lVar8] = uVar11;
        break;
      }
      lVar8 = lVar8 + 1;
    } while (pos->pNum[iVar1] != lVar8);
  }
  if ((uVar4 >> 0xe & 0xf) != 0) {
    uVar6 = (ulong)(uVar13 * 4);
    iVar1 = *(int *)((long)Board::PIECE_COLOR + uVar6);
    pos->material[iVar1] = pos->material[iVar1] + *(int *)((long)Board::PIECE_VAL + uVar6);
    pos->board[uVar12] = uVar13;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[uVar13][uVar12];
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar6) == 1) {
      iVar2 = Board::SQ64[uVar12];
      bitboard::setBit(pos->pawns + iVar1,iVar2);
      bitboard::setBit(pos->pawns + 2,iVar2);
    }
    pos->pList[uVar13][pos->pNum[uVar13]] = uVar12;
    pos->pNum[uVar13] = pos->pNum[uVar13] + 1;
  }
  if ((uVar4 >> 0x14 & 0xf) != 0) {
    lVar8 = (long)pos->board[uVar11];
    iVar1 = Board::PIECE_COLOR[lVar8];
    pos->material[iVar1] = pos->material[iVar1] - Board::PIECE_VAL[lVar8];
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar8][uVar11];
    pos->board[uVar11] = 0;
    if (Board::PIECE_NO_TEAM[lVar8] == 1) {
      iVar2 = Board::SQ64[uVar11];
      bitboard::clearBit(pos->pawns + iVar1,iVar2);
      bitboard::clearBit(pos->pawns + 2,iVar2);
    }
    lVar7 = (long)pos->pNum[lVar8];
    lVar9 = -1;
    if (0 < lVar7) {
      lVar10 = 0;
      do {
        lVar9 = lVar10;
        if (pos->pList[lVar8][lVar10] == uVar11) break;
        lVar10 = lVar10 + 1;
        lVar9 = -1;
      } while (lVar7 != lVar10);
    }
    pos->pNum[lVar8] = pos->pNum[lVar8] + -1;
    pos->pList[lVar8][lVar9] = pos->pList[lVar8 + -1][lVar7 + 9];
    lVar8 = 7;
    if (Board::PIECE_COLOR[uVar4 >> 0x14 & 0xf] == 0) {
      lVar8 = 1;
    }
    uVar6 = (ulong)(uint)((int)lVar8 * 4);
    iVar1 = *(int *)((long)Board::PIECE_COLOR + uVar6);
    pos->material[iVar1] = pos->material[iVar1] + *(int *)((long)Board::PIECE_VAL + uVar6);
    pos->board[uVar11] = (int)lVar8;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar8][uVar11];
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar6) == 1) {
      iVar2 = Board::SQ64[uVar11];
      bitboard::setBit(pos->pawns + iVar1,iVar2);
      bitboard::setBit(pos->pawns + 2,iVar2);
    }
    pos->pList[lVar8][pos->pNum[lVar8]] = uVar11;
    pos->pNum[lVar8] = pos->pNum[lVar8] + 1;
  }
  return;
}

Assistant:

void board::makemove::undo(Board& pos)
{
    pos.decrementPly();
    Undo undo = pos.popHistory();
    int move = undo.getMoveValue();
    int from = Move::FROMSQ(move);
    int to = Move::TOSQ(move);
    int captured = Move::CAPTURED(move);
    int promoted = Move::PROMOTED(move);
    pos.setFiftyMove(undo.getFiftyMove());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.setEnPas(undo.getEnPas());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.setCastlePerm(undo.getCastlePerm());
    pos.hashCastle();
    pos.updateSide();
    pos.hashSide();
    if (Move::MFLAGEP & move) {
        if (pos.getSide() == WHITE) {
            addPiece(BP, to - 10, pos);
        }
        else {
            addPiece(WP, to + 10, pos);
        }
    }
    else if (Move::MFLAGCA & move) {
        if (to == C1) {
            movePiece(D1, A1, pos);
        }
        else if (to == C8) {
            movePiece(D8, A8, pos);
        }
        else if (to == G1) {
            movePiece(F1, H1, pos);
        }
        else if (to == G8) {
            movePiece(F8, H8, pos);
        }
    }
    movePiece(to, from, pos);
    if (captured != EMPTY) {
        addPiece(captured, to, pos);
    }
    if (promoted != EMPTY) {
        clearPiece(from, pos);
        addPiece(Board::PIECE_COLOR[promoted] == WHITE ? WP : BP, from, pos);
    }
}